

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

uint8_vec * __thiscall basist::ktx2_transcoder::find_key(ktx2_transcoder *this,string *key_name)

{
  int iVar1;
  key_value *pkVar2;
  ulong i;
  
  i = 0xffffffffffffffff;
  do {
    i = i + 1;
    if ((this->m_key_values).m_size <= i) {
      return (uint8_vec *)0x0;
    }
    pkVar2 = basisu::vector<basist::ktx2_transcoder::key_value>::operator[](&this->m_key_values,i);
    iVar1 = strcmp((char *)(pkVar2->m_key).m_p,(key_name->_M_dataplus)._M_p);
  } while (iVar1 != 0);
  pkVar2 = basisu::vector<basist::ktx2_transcoder::key_value>::operator[](&this->m_key_values,i);
  return &pkVar2->m_value;
}

Assistant:

const basisu::uint8_vec* ktx2_transcoder::find_key(const std::string& key_name) const
	{
		for (uint32_t i = 0; i < m_key_values.size(); i++)
			if (strcmp((const char *)m_key_values[i].m_key.data(), key_name.c_str()) == 0)
				return &m_key_values[i].m_value;

		return nullptr;
	}